

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
sequence<boost::xpressive::detail::keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>
          (sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *xpr)

{
  counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pcVar1;
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  
  *this = (sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>)0x0;
  *(undefined8 *)(this + 8) = 0x3ffffffe;
  *(undefined4 *)(this + 0x10) = 2;
  local_18.px = &xpr->px->
                 super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  if ((dynamic_xpression<boost::xpressive::detail::keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_18.px ==
      (dynamic_xpression<boost::xpressive::detail::keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    *(undefined8 *)(this + 0x18) = 0;
  }
  else {
    LOCK();
    pcVar1 = &((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&(local_18.px)->
                   super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )->
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
    UNLOCK();
    *(matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      **)(this + 0x18) = local_18.px;
    if ((dynamic_xpression<boost::xpressive::detail::keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_18.px !=
        (dynamic_xpression<boost::xpressive::detail::keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      pcVar1 = &((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&(local_18.px)->
                     super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )->
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
      UNLOCK();
    }
  }
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~intrusive_ptr(&local_18);
  *(shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)(this + 0x20) = &xpr->px->next_;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  return;
}

Assistant:

sequence(intrusive_ptr<dynamic_xpression<Matcher, BidiIter> > const &xpr)
      : pure_(Matcher::pure)
      , width_(xpr->Matcher::get_width())
      , quant_(static_cast<quant_enum>(Matcher::quant))
      , head_(xpr)
      , tail_(&xpr->next_)
      , alt_end_xpr_()
      , alternates_(0)
    {
    }